

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

optional<CPubKey> * __thiscall
Satisfier<XOnlyPubKey>::
CPubFromPKHBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (Satisfier<XOnlyPubKey> *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last)

{
  long lVar1;
  bool bVar2;
  difference_type dVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RDX;
  optional<CPubKey> *in_RDI;
  long in_FS_OFFSET;
  CKeyID key_id;
  CPubKey pubkey;
  optional<CPubKey> *in_stack_ffffffffffffff58;
  optional<CPubKey> *this_00;
  SignatureData *sigdata;
  SigningProvider *provider;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  dVar3 = __gnu_cxx::operator-
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_RDI,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)in_RDI);
  if (dVar3 != 0x14) {
    __assert_fail("last - first == 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                  ,0xdd,
                  "std::optional<CPubKey> Satisfier<XOnlyPubKey>::CPubFromPKHBytes(I, I) const [Pk = XOnlyPubKey, I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  CPubKey::CPubKey((CPubKey *)in_stack_ffffffffffffff58);
  CKeyID::CKeyID((CKeyID *)in_stack_ffffffffffffff58);
  sigdata = (SignatureData *)in_RCX._M_current;
  provider = (SigningProvider *)in_RDX._M_current;
  base_blob<160U>::begin((base_blob<160U> *)in_stack_ffffffffffffff58);
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
            (in_RDX,in_RCX,(uchar *)this_00);
  bVar2 = GetPubKey(provider,sigdata,(CKeyID *)in_RDX._M_current,(CPubKey *)in_RCX._M_current);
  if (bVar2) {
    std::optional<CPubKey>::optional<CPubKey,_true>(this_00,(CPubKey *)in_RDI);
  }
  else {
    std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
              ((vector<CKeyID,_std::allocator<CKeyID>_> *)this_00,(value_type *)in_RDI);
    std::optional<CPubKey>::optional(in_stack_ffffffffffffff58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CPubKey> CPubFromPKHBytes(I first, I last) const {
        assert(last - first == 20);
        CPubKey pubkey;
        CKeyID key_id;
        std::copy(first, last, key_id.begin());
        if (GetPubKey(m_provider, m_sig_data, key_id, pubkey)) return pubkey;
        m_sig_data.missing_pubkeys.push_back(key_id);
        return {};
    }